

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KRef_Ptr.h
# Opt level: O3

KRef_Ptr<KDIS::DATA_TYPE::Descriptor> * __thiscall
KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=
          (KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *this,KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *p)

{
  Descriptor *pDVar1;
  RefCounter *pRVar2;
  
  if (this->m_pRef != p->m_pRef) {
    unRef(this);
    pDVar1 = p->m_pRef;
    this->m_pRef = pDVar1;
    pRVar2 = p->m_piCount;
    this->m_piCount = pRVar2;
    if (pDVar1 != (Descriptor *)0x0) {
      *pRVar2 = *pRVar2 + 1;
    }
  }
  return this;
}

Assistant:

KRef_Ptr<Type> & operator=( const KRef_Ptr<Type> & p )
    {
        if( m_pRef == p.m_pRef )return *this;
        unRef();
        m_pRef = p.m_pRef;
        m_piCount = p.m_piCount;
        ref();
        return *this;
    }